

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

Gia_Man_t *
Gia_ManAreaBalance(Gia_Man_t *p,int fSimpleAnd,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Gia_Man_t *local_58;
  Gia_Man_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *vCiLevels;
  Gia_Man_t *pNew2;
  Gia_Man_t *pNew1;
  Gia_Man_t *pNew;
  Gia_Man_t *pNew0;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nNewNodesMax_local;
  int fSimpleAnd_local;
  Gia_Man_t *p_local;
  
  pNew0._0_4_ = fVeryVerbose;
  pNew0._4_4_ = fVerbose;
  fVeryVerbose_local = nNewNodesMax;
  fVerbose_local = fSimpleAnd;
  _nNewNodesMax_local = p;
  if ((p->pManTime != (void *)0x0) && (p->vLevels == (Vec_Int_t *)0x0)) {
    Gia_ManLevelWithBoxes(p);
  }
  local_48 = Gia_ManGetCiLevels(_nNewNodesMax_local);
  iVar1 = Gia_ManHasMapping(_nNewNodesMax_local);
  if (iVar1 == 0) {
    local_50 = _nNewNodesMax_local;
  }
  else {
    local_50 = (Gia_Man_t *)Dsm_ManDeriveGia(_nNewNodesMax_local,0);
  }
  pNew = local_50;
  if (pNew0._4_4_ != 0) {
    Gia_ManPrintStats(local_50,(Gps_Par_t *)0x0);
  }
  if (fVerbose_local == 0) {
    local_58 = Gia_ManDupMuxes(pNew,2);
  }
  else {
    local_58 = Gia_ManDup(pNew);
  }
  pNew1 = local_58;
  if (pNew0._4_4_ != 0) {
    Gia_ManPrintStats(local_58,(Gps_Par_t *)0x0);
  }
  if (pNew != _nNewNodesMax_local) {
    Gia_ManStop(pNew);
  }
  pNew2 = Dam_ManAreaBalanceInt(pNew1,local_48,fVeryVerbose_local,pNew0._4_4_,(int)pNew0);
  if (pNew0._4_4_ != 0) {
    Gia_ManPrintStats(pNew2,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pNew1);
  Vec_IntFreeP(&local_48);
  vCiLevels = (Vec_Int_t *)Gia_ManDupNoMuxes(pNew2);
  if (pNew0._4_4_ != 0) {
    Gia_ManPrintStats((Gia_Man_t *)vCiLevels,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pNew2);
  iVar1 = Gia_ManIsNormalized((Gia_Man_t *)vCiLevels);
  if (iVar1 == 0) {
    pNew2 = (Gia_Man_t *)vCiLevels;
    vCiLevels = (Vec_Int_t *)Gia_ManDupNormalize((Gia_Man_t *)vCiLevels,0);
    Gia_ManStop(pNew2);
  }
  Gia_ManTransferTiming((Gia_Man_t *)vCiLevels,_nNewNodesMax_local);
  return (Gia_Man_t *)vCiLevels;
}

Assistant:

Gia_Man_t * Gia_ManAreaBalance( Gia_Man_t * p, int fSimpleAnd, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew0, * pNew, * pNew1, * pNew2;
    Vec_Int_t * vCiLevels;
    // determine CI levels
    if ( p->pManTime && p->vLevels == NULL )
        Gia_ManLevelWithBoxes( p );
    vCiLevels = Gia_ManGetCiLevels( p );
    // get the starting manager
    pNew0 = Gia_ManHasMapping(p) ? (Gia_Man_t *)Dsm_ManDeriveGia(p, 0) : p;
    if ( fVerbose )     Gia_ManPrintStats( pNew0, NULL );
    // derive internal manager
    pNew = fSimpleAnd ? Gia_ManDup( pNew0 ) : Gia_ManDupMuxes( pNew0, 2 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pNew0 != p ) Gia_ManStop( pNew0 );
    // perform the operation
    pNew1 = Dam_ManAreaBalanceInt( pNew, vCiLevels, nNewNodesMax, fVerbose, fVeryVerbose );
    if ( fVerbose )     Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    Vec_IntFreeP( &vCiLevels );
    // derive the final result
    pNew2 = Gia_ManDupNoMuxes( pNew1 );
    if ( fVerbose )     Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    // normalize if needed
    if ( !Gia_ManIsNormalized(pNew2) )
    {
        pNew2 = Gia_ManDupNormalize( pNew1 = pNew2, 0 );
        Gia_ManStop( pNew1 );
    }
    Gia_ManTransferTiming( pNew2, p );
    return pNew2;
}